

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyValueFile.h
# Opt level: O1

string * __thiscall
KeyValueFile::trimStr(string *__return_storage_ptr__,KeyValueFile *this,string *s)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  
  uVar2 = (uint)s->_M_string_length;
  uVar4 = (ulong)uVar2;
  uVar3 = uVar2 - 1;
  if (1 < (int)uVar2) {
    uVar4 = (ulong)uVar3 + 1;
    do {
      cVar1 = (s->_M_dataplus)._M_p[uVar4 - 1];
      if ((cVar1 != ' ') && (cVar1 != '\t')) {
        uVar3 = (int)uVar4 - 1;
        goto LAB_001234cd;
      }
      uVar4 = uVar4 - 1;
    } while (1 < (long)uVar4);
    uVar3 = 0;
    uVar4 = 1;
  }
LAB_001234cd:
  bVar8 = 0 < (int)uVar4;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      cVar1 = (s->_M_dataplus)._M_p[uVar5];
      if ((cVar1 != ' ') && (cVar1 != '\t')) {
        if (bVar8) {
          pcVar7 = (s->_M_dataplus)._M_p + uVar5;
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar6 = pcVar7 + ((long)(int)uVar3 - uVar5) + 1;
          goto LAB_00123534;
        }
        break;
      }
      uVar5 = uVar5 + 1;
      bVar8 = uVar5 < (uVar4 & 0xffffffff);
    } while (uVar5 != (uVar4 & 0xffffffff));
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar6 = "";
  pcVar7 = "";
LAB_00123534:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string trimStr(std::string s)
  {
    int from = 0;
    int to = int(s.length()) - 1;
    while (to > 0 && isSpace(s[to]))
      to--;
    while (from <= to && isSpace(s[from]))
      from++;
    if (to < from)
      return std::string("");
    return std::string(&(s[from]), to - from + 1);
  }